

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O1

void __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::replaceUnsigned<double,unsigned_int>
          (LLVMNonTrappingFPToIntLoweringImpl *this,Unary *curr)

{
  BinaryOp BVar1;
  BinaryOp BVar2;
  Type type_;
  uintptr_t uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  Index IVar6;
  UnaryOp UVar7;
  LocalSet *this_00;
  Const *pCVar8;
  Binary *this_01;
  Expression *pEVar9;
  Binary *this_02;
  Binary *this_03;
  Unary *this_04;
  If *this_05;
  ulong uVar10;
  Type in_R8;
  optional<wasm::Type> type__00;
  Builder local_40;
  Builder builder;
  
  uVar5 = curr->op - TruncSatUFloat32ToInt32;
  if ((uVar5 < 7) && ((0x55U >> (uVar5 & 0x1f) & 1) != 0)) {
    BVar1 = *(BinaryOp *)(&DAT_00e0fa2c + (ulong)uVar5 * 4);
    BVar2 = *(BinaryOp *)(&DAT_00e0fa48 + (ulong)uVar5 * 4);
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
         ).
         super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .
         super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .currModule;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (curr->value->type).id;
    IVar6 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                            ).
                            super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .
                            super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
    pEVar9 = curr->value;
    type_.id = (pEVar9->type).id;
    builder.wasm._4_4_ = IVar6;
    this_00 = (LocalSet *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
    this_00->index = IVar6;
    this_00->value = pEVar9;
    LocalSet::makeTee(this_00,type_);
    pCVar8 = Builder::makeConst<double>(&local_40,4294967295.0);
    this_01 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar2;
    this_01->left = (Expression *)this_00;
    this_01->right = (Expression *)pCVar8;
    Binary::finalize(this_01);
    uVar3 = (curr->value->type).id;
    pEVar9 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar9->_id = LocalGetId;
    *(Index *)(pEVar9 + 1) = builder.wasm._4_4_;
    (pEVar9->type).id = uVar3;
    pCVar8 = Builder::makeConst<double>(&local_40,0.0);
    this_02 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_02->op = BVar1;
    this_02->left = pEVar9;
    this_02->right = (Expression *)pCVar8;
    Binary::finalize(this_02);
    this_03 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_03->op = AndInt32;
    this_03->left = (Expression *)this_01;
    this_03->right = (Expression *)this_02;
    Binary::finalize(this_03);
    UVar7 = getReplacementOp(this,curr->op);
    uVar3 = (curr->value->type).id;
    pEVar9 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar9->_id = LocalGetId;
    *(Index *)(pEVar9 + 1) = builder.wasm._4_4_;
    (pEVar9->type).id = uVar3;
    this_04 = (Unary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
    (this_04->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_04->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_04->op = UVar7;
    this_04->value = pEVar9;
    Unary::finalize(this_04);
    pCVar8 = Builder::makeConst<unsigned_int>(&local_40,0);
    uVar10 = 0x28;
    this_05 = (If *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (this_05->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
    (this_05->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
    this_05->condition = (Expression *)this_03;
    this_05->ifTrue = (Expression *)this_04;
    this_05->ifFalse = (Expression *)pCVar8;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
    If::finalize(this_05,type__00);
    Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                      ).
                      super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      .
                      super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                     ,(Expression *)this_05);
    return;
  }
  handle_unreachable("Unexpected opcode",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                     ,0x69);
}

Assistant:

void replaceUnsigned(Unary* curr) {
    BinaryOp ltOp, geOp;

    switch (curr->op) {
      case TruncSatUFloat32ToInt32:
      case TruncSatUFloat32ToInt64:
        ltOp = LtFloat32;
        geOp = GeFloat32;
        break;
      case TruncSatUFloat64ToInt32:
      case TruncSatUFloat64ToInt64:
        ltOp = LtFloat64;
        geOp = GeFloat64;
        break;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }

    Builder builder(*getModule());
    Index v = Builder::addVar(getFunction(), curr->value->type);
    // if op < INT_MAX and op >= 0 then use the trapping operation, else return
    // 0
    replaceCurrent(builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          ltOp,
          builder.makeLocalTee(v, curr->value, curr->value->type),
          builder.makeConst(static_cast<From>(std::numeric_limits<To>::max()))),
        builder.makeBinary(geOp,
                           builder.makeLocalGet(v, curr->value->type),
                           builder.makeConst(static_cast<From>(0.0)))),
      builder.makeUnary(getReplacementOp(curr->op),
                        builder.makeLocalGet(v, curr->value->type)),
      builder.makeConst(static_cast<To>(0))));
  }